

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsWebServer.cpp
# Opt level: O2

void __thiscall Listener::Listener(Listener *this,io_context *context,endpoint *endpoint,bool webs)

{
  acceptor *this_00;
  uint extraout_var;
  socklen_t __len;
  undefined7 in_register_00000009;
  char *what;
  error_category *extraout_RDX;
  error_code eCode;
  boolean<1,_2> local_7c;
  undefined1 local_78 [48];
  strand<boost::asio::io_context::basic_executor_type<std::allocator<void>,_0U>_> local_48;
  
  __len = (socklen_t)CONCAT71(in_register_00000009,webs);
  (this->super_enable_shared_from_this<Listener>)._M_weak_this.
  super___weak_ptr<Listener,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_enable_shared_from_this<Listener>)._M_weak_this.
  super___weak_ptr<Listener,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->ioc = context;
  boost::asio::make_strand<boost::asio::io_context>(&local_48,context,(type *)0x0);
  boost::asio::execution::
  any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>
  ::
  any_executor<boost::asio::strand<boost::asio::io_context::basic_executor_type<std::allocator<void>,0u>>>
            ((any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>
              *)local_78,&local_48,(type *)0x0);
  this_00 = &this->acceptor;
  boost::asio::detail::
  io_object_impl<boost::asio::detail::reactive_socket_service<boost::asio::ip::tcp>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::io_object_impl(&this_00->impl_,(executor_type *)local_78);
  boost::asio::execution::detail::any_executor_base::~any_executor_base
            ((any_executor_base *)local_78);
  CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_48.impl_.
              super___shared_ptr<boost::asio::detail::strand_executor_service::strand_impl,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  this->websocket = webs;
  local_78._0_8_ = (ulong)(uint3)local_78._5_3_ << 0x28;
  local_78._8_8_ = &boost::system::detail::cat_holder<void>::system_category_instance;
  local_7c.value_ = (uint)((endpoint->impl_).data_.base.sa_family != 2) * 8 + 2;
  local_78._0_4_ =
       boost::asio::
       basic_socket_acceptor<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
       ::open(this_00,(char *)&local_7c,(int)local_78);
  local_78._4_4_ = extraout_var;
  local_78._8_8_ = extraout_RDX;
  if ((extraout_var & 1) == 0) {
    local_7c.value_ = 1;
    boost::asio::
    basic_socket_acceptor<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>
    ::set_option<boost::asio::detail::socket_option::boolean<1,2>>
              ((basic_socket_acceptor<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>
                *)this_00,&local_7c,(error_code *)local_78);
    if (local_78[4] == '\x01') {
      what = "helics acceptor set_option";
    }
    else {
      boost::asio::
      basic_socket_acceptor<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
      ::bind(this_00,(int)endpoint,(sockaddr *)local_78,__len);
      if (local_78[4] == '\x01') {
        what = "helics acceptor bind";
      }
      else {
        boost::asio::
        basic_socket_acceptor<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
        ::listen(this_00,0x1000,(int)local_78);
        if (local_78[4] != '\x01') {
          return;
        }
        what = "helics acceptor listen";
      }
    }
  }
  else {
    what = "helics acceptor open";
  }
  eCode.cat_ = (error_category *)local_78._8_8_;
  eCode.val_ = local_78._0_4_;
  eCode.failed_ = (bool)local_78[4];
  eCode._5_3_ = local_78._5_3_;
  fail(eCode,what);
  return;
}

Assistant:

Listener(net::io_context& context, const tcp::endpoint& endpoint, bool webs = false):
        ioc(context), acceptor(net::make_strand(ioc)), websocket{webs}
    {
        beast::error_code eCode;

        // Open the acceptor
        eCode = acceptor.open(endpoint.protocol(), eCode);
        if (eCode) {
            fail(eCode, "helics acceptor open");
            return;
        }

        // Allow address reuse
        (void)(acceptor.set_option(net::socket_base::reuse_address(true), eCode));
        if (eCode) {
            fail(eCode, "helics acceptor set_option");
            return;
        }

        // Bind to the server address
        (void)(acceptor.bind(endpoint, eCode));
        if (eCode) {
            fail(eCode, "helics acceptor bind");
            return;
        }

        // Start listening for connections
        (void)(acceptor.listen(net::socket_base::max_listen_connections, eCode));
        if (eCode) {
            fail(eCode, "helics acceptor listen");
            return;
        }
    }